

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

bool __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::erase
          (iterator *this,allocator_type *alloc,bool shouldRecomputeBounds)

{
  IntervalMap<int,_int,_0U> *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t *puVar5;
  allocator_type *alloc_00;
  byte in_DL;
  undefined8 in_RSI;
  iterator *in_RDI;
  LeafNode<int,_int,_16U,_false> *node;
  uint32_t offset;
  Path *path;
  IntervalMap<int,_int,_0U> *map;
  LeafNode<int,_int,_16U,_false> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint32_t uVar6;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  Path *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint32_t level;
  bool local_1;
  
  level = (uint32_t)((ulong)in_RSI >> 0x20);
  pIVar1 = (in_RDI->super_const_iterator).map;
  this_00 = &(in_RDI->super_const_iterator).path;
  puVar5 = IntervalMapDetails::Path::leafOffset((Path *)0x83338d);
  uVar6 = *puVar5;
  bVar2 = IntervalMap<int,_int,_0U>::const_iterator::isFlat
                    ((const_iterator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                    );
  if (bVar2) {
    IntervalMapDetails::NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>::erase
              ((NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff98,0);
    pIVar1->rootSize = pIVar1->rootSize - 1;
    IntervalMapDetails::Path::setSize
              ((Path *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
               (uint32_t)in_stack_ffffffffffffffa8);
    local_1 = false;
  }
  else {
    alloc_00 = (allocator_type *)
               IntervalMapDetails::Path::
               leaf<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>((Path *)0x8333f7);
    uVar3 = IntervalMapDetails::Path::leafSize((Path *)0x833406);
    if (uVar3 == 1) {
      PoolAllocator<char,192ul,64ul>::
      destroy<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                ((PoolAllocator<char,_192UL,_64UL> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      eraseNode((iterator *)this_00,uVar6,alloc_00);
      local_1 = true;
    }
    else {
      iVar4 = uVar6 + 1;
      IntervalMapDetails::Path::leafSize((Path *)0x833464);
      IntervalMapDetails::NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>::erase
                ((NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U> *)
                 CONCAT44(iVar4,uVar6),(uint32_t)((ulong)alloc_00 >> 0x20),(uint32_t)alloc_00,0);
      uVar6 = pIVar1->height;
      IntervalMapDetails::Path::leafSize((Path *)0x83349a);
      IntervalMapDetails::Path::setSize
                ((Path *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                 (uint32_t)((ulong)this_00 >> 0x20),(uint32_t)this_00);
      if ((in_DL & 1) != 0) {
        recomputeBounds(in_RDI,level);
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::erase(allocator_type& alloc,
                                                   bool shouldRecomputeBounds) {
    auto& map = *this->map;
    auto& path = this->path;
    SLANG_ASSERT(this->valid());

    uint32_t offset = path.leafOffset();
    if (this->isFlat()) {
        map.rootLeaf.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        return false;
    }

    // Nodes are not allowed to become empty, so erase the node itself
    // if that were to be the case.
    auto& node = path.template leaf<Leaf>();
    if (path.leafSize() == 1) {
        alloc.destroy(&node);
        eraseNode(map.height, alloc);
        return true;
    }

    // Otherwise just erase the current entry.
    node.erase(offset, offset + 1, path.leafSize());
    path.setSize(map.height, path.leafSize() - 1);

    if (shouldRecomputeBounds)
        recomputeBounds(map.height);

    return false;
}